

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.h
# Opt level: O0

Tester * __thiscall leveldb::test::Tester::IsOk(Tester *this,Status *s)

{
  bool bVar1;
  ostream *poVar2;
  string local_38 [32];
  Status *local_18;
  Status *s_local;
  Tester *this_local;
  
  local_18 = s;
  s_local = (Status *)this;
  bVar1 = Status::ok(s);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&this->field_0x28," ");
    Status::ToString_abi_cxx11_((Status *)local_38);
    std::operator<<(poVar2,local_38);
    std::__cxx11::string::~string(local_38);
    this->ok_ = false;
  }
  return this;
}

Assistant:

Tester& IsOk(const Status& s) {
    if (!s.ok()) {
      ss_ << " " << s.ToString();
      ok_ = false;
    }
    return *this;
  }